

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.c
# Opt level: O0

void pnga_matmul_patch_alt
               (char *transa,char *transb,void *alpha,void *beta,Integer g_a,Integer *alo,
               Integer *ahi,Integer g_b,Integer *blo,Integer *bhi,Integer g_c,Integer *clo,
               Integer *chi)

{
  undefined8 uVar1;
  undefined8 uVar2;
  char *in_RSI;
  char *in_RDI;
  undefined8 *in_R9;
  undefined8 *in_stack_00000008;
  undefined8 *in_stack_00000018;
  undefined8 *in_stack_00000020;
  Integer in_stack_00000028;
  char *in_stack_00000030;
  Integer bdims [7];
  Integer adims [7];
  Integer hi;
  Integer lo;
  Integer brank;
  Integer arank;
  Integer btype;
  Integer atype;
  int jpos;
  int ipos;
  int d;
  int e;
  int bivec;
  int aivec;
  Integer *in_stack_000002e8;
  Integer in_stack_000002f0;
  void *in_stack_000002f8;
  void *in_stack_00000300;
  char *in_stack_00000308;
  char *in_stack_00000310;
  Integer *in_stack_00000350;
  int in_stack_00000358;
  Integer in_stack_00000360;
  Integer *in_stack_00000368;
  Integer *in_stack_00000370;
  int in_stack_00000378;
  Integer in_stack_00000380;
  Integer *in_stack_00000388;
  Integer *in_stack_00000390;
  long local_98;
  long local_90;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  
  if ((*in_RDI == 't') || (*in_RDI == 'T')) {
    pnga_inquire(adims[4],(Integer *)adims[3],(Integer *)adims[2],(Integer *)adims[1]);
    if (2 < local_90) {
      local_74 = -1;
      local_78 = -1;
      for (local_70 = 0; local_70 < local_90; local_70 = local_70 + 1) {
        if (((long)(in_stack_00000008[local_70] - in_R9[local_70]) < 1) || (local_74 != -1)) {
          if (((long)(in_stack_00000008[local_70] - in_R9[local_70]) < 1) || (local_78 != -1)) {
            if (0 < (long)(in_stack_00000008[local_70] - in_R9[local_70])) {
              pnga_error(in_stack_00000030,in_stack_00000028);
            }
          }
          else {
            local_78 = local_70;
          }
        }
        else {
          local_74 = local_70;
        }
      }
    }
    uVar1 = *in_R9;
    uVar2 = *in_stack_00000008;
    *in_R9 = in_R9[1];
    *in_stack_00000008 = in_stack_00000008[1];
    in_R9[1] = uVar1;
    in_stack_00000008[1] = uVar2;
  }
  if ((*in_RSI == 't') || (*in_RSI == 'T')) {
    pnga_inquire(adims[4],(Integer *)adims[3],(Integer *)adims[2],(Integer *)adims[1]);
    if (local_98 < 3) {
      uVar1 = *in_stack_00000018;
      uVar2 = *in_stack_00000020;
      *in_stack_00000018 = in_stack_00000018[1];
      *in_stack_00000020 = in_stack_00000020[1];
      in_stack_00000018[1] = uVar1;
      in_stack_00000020[1] = uVar2;
    }
    else {
      local_74 = -1;
      local_78 = -1;
      local_6c = 0;
      for (local_70 = 0; local_70 < local_98; local_70 = local_70 + 1) {
        if (((long)(in_stack_00000020[local_70] - in_stack_00000018[local_70]) < 1) ||
           (local_74 != -1)) {
          if (((long)(in_stack_00000020[local_70] - in_stack_00000018[local_70]) < 1) ||
             (local_78 != -1)) {
            if (0 < (long)(in_stack_00000020[local_70] - in_stack_00000018[local_70])) {
              pnga_error(in_stack_00000030,in_stack_00000028);
            }
          }
          else {
            local_78 = local_70;
            local_6c = local_6c + 1;
          }
        }
        else {
          local_74 = local_70;
          local_6c = local_6c + 1;
        }
      }
      if ((local_6c != 0) && (local_6c == 1)) {
        if ((long)local_74 < local_90 + -1) {
          local_78 = local_74 + 1;
        }
        else {
          local_78 = local_74;
          local_74 = local_74 + -1;
        }
      }
      uVar1 = in_stack_00000018[local_74];
      uVar2 = in_stack_00000020[local_74];
      in_stack_00000018[local_74] = in_stack_00000018[local_78];
      in_stack_00000020[local_74] = in_stack_00000020[local_78];
      in_stack_00000018[local_78] = uVar1;
      in_stack_00000020[local_78] = uVar2;
    }
  }
  gai_matmul_patch(in_stack_00000310,in_stack_00000308,in_stack_00000300,in_stack_000002f8,
                   in_stack_000002f0,in_stack_000002e8,in_stack_00000350,in_stack_00000358,
                   in_stack_00000360,in_stack_00000368,in_stack_00000370,in_stack_00000378,
                   in_stack_00000380,in_stack_00000388,in_stack_00000390);
  return;
}

Assistant:

void pnga_matmul_patch_alt(char *transa, char *transb, void *alpha, void *beta, 
    Integer g_a, Integer alo[], Integer ahi[], 
    Integer g_b, Integer blo[], Integer bhi[], 
    Integer g_c, Integer clo[], Integer chi[])
{
  int aivec, bivec;
  int e, d, ipos, jpos;
  Integer atype, btype, arank, brank, lo, hi;
  Integer adims[GA_MAX_DIM],bdims[GA_MAX_DIM];
  /* if the patch is transposed, find the two indices that correspond to the
   * non-unit dimensions */
  if (*transa == 't' || *transa == 'T') {
    pnga_inquire(g_a, &atype, &arank, adims);
    aivec = -1;
    if (arank > 2) {
      ipos = -1;
      jpos = -1;
      e = 0;
      /* find out how many patch dimensions are greater than 1*/
      for (d=0; d<arank; d++) {
        if (ahi[d]-alo[d] > 0 && ipos == -1) {
          ipos = d;
          e++;
        } else if (ahi[d]-alo[d] > 0 && jpos == -1) {
          jpos = d;
          e++;
        } else if (ahi[d]-alo[d] > 0) {
          pnga_error("Patch A has more than 2 dimensions",0);
        }
      }
      if (e == 0) {
        aivec = -1;
      } else if (e == 1) {
        /* array is a vector */
        aivec = ipos;
        if (ipos < arank-1) {
          jpos = ipos + 1;
        } else {
          jpos = ipos;
          ipos--;
        }
      } else {
        aivec = -1;
      }
    }
    lo = alo[0];
    hi = ahi[0];
    alo[0] = alo[1];
    ahi[0] = ahi[1];
    alo[1] = lo;
    ahi[1] = hi;
  }
  if (*transb == 't' || *transb == 'T') {
    pnga_inquire(g_b, &btype, &brank, bdims);
    bivec = -1;
    if (brank > 2) {
      ipos = -1;
      jpos = -1;
      e = 0;
      /* find out how many patch dimensions are greater than 1*/
      for (d=0; d<brank; d++) {
        if (bhi[d]-blo[d] > 0 && ipos == -1) {
          ipos = d;
          e++;
        } else if (bhi[d]-blo[d] > 0 && jpos == -1) {
          jpos = d;
          e++;
        } else if (bhi[d]-blo[d] > 0) {
          pnga_error("Patch A has more than 2 dimensions",0);
        }
      }
      if (e == 0) {
        bivec = -1;
      } else if (e == 1) {
        /* array is a vector */
        bivec = ipos;
        if (ipos < arank-1) {
          jpos = ipos + 1;
        } else {
          jpos = ipos;
          ipos--;
        }
      } else {
        bivec = -1;
      }
      lo = blo[ipos];
      hi = bhi[ipos];
      blo[ipos] = blo[jpos];
      bhi[ipos] = bhi[jpos];
      blo[jpos] = lo;
      bhi[jpos] = hi;
    } else {
      lo = blo[0];
      hi = bhi[0];
      blo[0] = blo[1];
      bhi[0] = bhi[1];
      blo[1] = lo;
      bhi[1] = hi;
    }
  }


  gai_matmul_patch(transa,transb,alpha,beta,g_a,alo,ahi,aivec,
    g_b,blo,bhi,bivec,g_c,clo,chi);
}